

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O3

void __thiscall CommandLine::~CommandLine(CommandLine *this)

{
  _Elt_pointer ppCVar1;
  List<CommandLineOption_*> *__range1;
  _Map_pointer pppCVar2;
  _Elt_pointer ppCVar3;
  _Elt_pointer ppCVar4;
  
  ppCVar4 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppCVar1 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppCVar4 != ppCVar1) {
    ppCVar3 = (this->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pppCVar2 = (this->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      if (*ppCVar4 != (CommandLineOption *)0x0) {
        (*(*ppCVar4)->_vptr_CommandLineOption[1])();
      }
      ppCVar4 = ppCVar4 + 1;
      if (ppCVar4 == ppCVar3) {
        ppCVar4 = pppCVar2[1];
        pppCVar2 = pppCVar2 + 1;
        ppCVar3 = ppCVar4 + 0x40;
      }
    } while (ppCVar4 != ppCVar1);
  }
  std::_Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>::~_Deque_base
            ((_Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_> *)this);
  return;
}

Assistant:

CommandLine::~CommandLine()
{
	for (CommandLineOption* opt : _options)
		delete opt;
}